

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::fromString(APInt *this,uint numbits,StringRef str,uint8_t radix)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  iterator pcVar5;
  uint local_78;
  uint local_74;
  uint digit;
  iterator e;
  uint shift;
  bool isNeg;
  size_t slen;
  iterator p;
  uint8_t radix_local;
  uint numbits_local;
  APInt *this_local;
  StringRef str_local;
  
  str_local.Data = (char *)str.Length;
  this_local = (APInt *)str.Data;
  str_local.Length = (size_t)&this_local;
  if (str_local.Data == (char *)0x0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7ad,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((((radix == '\n') || (radix == '\b')) || (radix == '\x10')) ||
     ((radix == '\x02' || (bVar2 = false, radix == '$')))) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("(radix == 10 || radix == 8 || radix == 16 || radix == 2 || radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7b0,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  slen = (size_t)StringRef::begin((StringRef *)&this_local);
  _shift = str_local.Data;
  cVar1 = *(char *)slen;
  if ((*(char *)slen == '-') || (*(char *)slen == '+')) {
    slen = slen + 1;
    _shift = str_local.Data + -1;
    if (_shift == (char *)0x0) {
      __assert_fail("slen && \"String is only a sign, needs a value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7b8,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
  }
  if ((_shift <= (char *)(ulong)numbits) || (bVar2 = false, radix != '\x02')) {
    bVar2 = true;
  }
  if (bVar2) {
    if (((ulong)((long)(_shift + -1) * 3) < (ulong)numbits ||
         (long)(_shift + -1) * 3 - (ulong)numbits == 0) || (bVar2 = false, radix != '\b')) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("((slen-1)*3 <= numbits || radix != 8) && \"Insufficient bit width\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7bb,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
    if (((ulong)((long)(_shift + -1) * 4) <= (ulong)numbits) || (bVar2 = false, radix != '\x10')) {
      bVar2 = true;
    }
    if (bVar2) {
      if (((ulong)((long)(_shift + -1) * 0x40) / 0x16 <= (ulong)numbits) ||
         (bVar2 = false, radix != '\n')) {
        bVar2 = true;
      }
      if (bVar2) {
        bVar2 = isSingleWord(this);
        if (bVar2) {
          (this->U).VAL = 0;
        }
        else {
          uVar3 = getNumWords(this);
          puVar4 = getClearedMemory(uVar3);
          (this->U).pVal = puVar4;
        }
        if (radix == '\x10') {
          local_74 = 4;
        }
        else {
          if (radix == '\b') {
            local_78 = 3;
          }
          else {
            local_78 = (uint)(radix == '\x02');
          }
          local_74 = local_78;
        }
        pcVar5 = StringRef::end((StringRef *)&this_local);
        while( true ) {
          if ((iterator)slen == pcVar5) {
            if (cVar1 == '-') {
              negate(this);
            }
            return;
          }
          uVar3 = getDigit(*(char *)slen,radix);
          if (radix <= uVar3) break;
          if ((char *)0x1 < _shift) {
            if (local_74 == 0) {
              operator*=(this,(ulong)radix);
            }
            else {
              operator<<=(this,local_74);
            }
          }
          operator+=(this,(ulong)uVar3);
          slen = slen + 1;
        }
        __assert_fail("digit < radix && \"Invalid character in digit string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                      ,0x7cc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
      }
      __assert_fail("(((slen-1)*64)/22 <= numbits || radix != 10) && \"Insufficient bit width\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7be,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
    __assert_fail("((slen-1)*4 <= numbits || radix != 16) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7bc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  __assert_fail("(slen <= numbits || radix != 2) && \"Insufficient bit width\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x7ba,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
}

Assistant:

void APInt::fromString(unsigned numbits, StringRef str, uint8_t radix) {
  // Check our assumptions here
  assert(!str.empty() && "Invalid string length");
  assert((radix == 10 || radix == 8 || radix == 16 || radix == 2 ||
          radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  StringRef::iterator p = str.begin();
  size_t slen = str.size();
  bool isNeg = *p == '-';
  if (*p == '-' || *p == '+') {
    p++;
    slen--;
    assert(slen && "String is only a sign, needs a value.");
  }
  assert((slen <= numbits || radix != 2) && "Insufficient bit width");
  assert(((slen-1)*3 <= numbits || radix != 8) && "Insufficient bit width");
  assert(((slen-1)*4 <= numbits || radix != 16) && "Insufficient bit width");
  assert((((slen-1)*64)/22 <= numbits || radix != 10) &&
         "Insufficient bit width");

  // Allocate memory if needed
  if (isSingleWord())
    U.VAL = 0;
  else
    U.pVal = getClearedMemory(getNumWords());

  // Figure out if we can shift instead of multiply
  unsigned shift = (radix == 16 ? 4 : radix == 8 ? 3 : radix == 2 ? 1 : 0);

  // Enter digit traversal loop
  for (StringRef::iterator e = str.end(); p != e; ++p) {
    unsigned digit = getDigit(*p, radix);
    assert(digit < radix && "Invalid character in digit string");

    // Shift or multiply the value by the radix
    if (slen > 1) {
      if (shift)
        *this <<= shift;
      else
        *this *= radix;
    }

    // Add in the digit we just interpreted
    *this += digit;
  }
  // If its negative, put it in two's complement form
  if (isNeg)
    this->negate();
}